

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int l_strcmp(TString *ls,TString *rs)

{
  undefined1 *puVar1;
  bool bVar2;
  uint uVar3;
  TString *pTVar4;
  TString *__s2;
  uint unaff_EBP;
  TString *pTVar5;
  TString *__s1;
  TString *pTVar6;
  
  if (ls->tt == '\x04') {
    pTVar6 = (TString *)(ulong)ls->shrlen;
  }
  else {
    pTVar6 = (ls->u).hnext;
  }
  if (rs->tt == '\x04') {
    pTVar5 = (TString *)(ulong)rs->shrlen;
  }
  else {
    pTVar5 = (rs->u).hnext;
  }
  __s1 = ls + 1;
  __s2 = rs + 1;
  do {
    uVar3 = strcoll((char *)__s1,(char *)__s2);
    if (uVar3 == 0) {
      pTVar4 = (TString *)strlen((char *)__s1);
      if (pTVar4 == pTVar5) {
        unaff_EBP = (uint)(pTVar4 != pTVar6);
      }
      else {
        if (pTVar4 != pTVar6) {
          __s1 = (TString *)((undefined1 *)((long)&__s1->next + 1) + (long)pTVar4);
          puVar1 = (undefined1 *)((long)&pTVar4->next + 1);
          pTVar6 = (TString *)((long)pTVar6 - (long)puVar1);
          __s2 = (TString *)((char *)((long)&__s2->next + 1) + (long)pTVar4);
          pTVar5 = (TString *)((long)pTVar5 - (long)puVar1);
          bVar2 = true;
          goto LAB_00125ac4;
        }
        unaff_EBP = 0xffffffff;
      }
      bVar2 = false;
    }
    else {
      bVar2 = false;
      unaff_EBP = uVar3;
    }
LAB_00125ac4:
    if (!bVar2) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int l_strcmp (const TString *ls, const TString *rs) {
  const char *l = getstr(ls);
  size_t ll = tsslen(ls);
  const char *r = getstr(rs);
  size_t lr = tsslen(rs);
  for (;;) {  /* for each segment */
    int temp = strcoll(l, r);
    if (temp != 0)  /* not equal? */
      return temp;  /* done */
    else {  /* strings are equal up to a '\0' */
      size_t len = strlen(l);  /* index of first '\0' in both strings */
      if (len == lr)  /* 'rs' is finished? */
        return (len == ll) ? 0 : 1;  /* check 'ls' */
      else if (len == ll)  /* 'ls' is finished? */
        return -1;  /* 'ls' is less than 'rs' ('rs' is not finished) */
      /* both strings longer than 'len'; go on comparing after the '\0' */
      len++;
      l += len; ll -= len; r += len; lr -= len;
    }
  }
}